

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O3

void gray_record_cell(PWorker worker)

{
  int iVar1;
  long lVar2;
  PCell *ppTVar3;
  PCell_conflict pTVar4;
  int iVar5;
  long lVar6;
  TArea TVar7;
  PCell_conflict pTVar8;
  long lVar9;
  
  lVar2 = worker->area;
  iVar1 = worker->cover;
  if (lVar2 != 0 || iVar1 != 0) {
    lVar6 = worker->count_ex;
    if (worker->ex < worker->count_ex) {
      lVar6 = worker->ex;
    }
    ppTVar3 = worker->ycells + worker->ey;
    pTVar8 = *ppTVar3;
    if (pTVar8 == (PCell_conflict)0x0) {
      pTVar8 = (PCell)0x0;
    }
    else {
      lVar9 = (long)pTVar8->x;
      if (lVar9 <= lVar6) {
        do {
          pTVar4 = pTVar8;
          if (lVar6 == lVar9) {
            TVar7 = pTVar4->area;
            iVar5 = pTVar4->cover;
            goto LAB_001219b8;
          }
          pTVar8 = pTVar4->next;
          if (pTVar8 == (PCell)0x0) {
            pTVar8 = (PCell)0x0;
            break;
          }
          lVar9 = (long)pTVar8->x;
        } while (lVar9 <= lVar6);
        ppTVar3 = &pTVar4->next;
      }
    }
    lVar9 = worker->num_cells;
    if (worker->max_cells <= lVar9) {
      longjmp((__jmp_buf_tag *)worker->jump_buffer,1);
    }
    worker->num_cells = lVar9 + 1;
    pTVar4 = worker->cells + lVar9;
    pTVar4->x = (int)lVar6;
    pTVar4->area = 0;
    pTVar4->cover = 0;
    pTVar4->next = pTVar8;
    *ppTVar3 = pTVar4;
    iVar5 = 0;
    TVar7 = 0;
LAB_001219b8:
    pTVar4->area = TVar7 + lVar2;
    pTVar4->cover = iVar1 + iVar5;
  }
  return;
}

Assistant:

static void
  gray_record_cell( RAS_ARG )
  {
    if ( ras.area | ras.cover )
    {
      PCell  cell = gray_find_cell( RAS_VAR );


      cell->area  += ras.area;
      cell->cover += ras.cover;
    }
  }